

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::StrictMock<dying_buffer>::StrictMock(StrictMock<dying_buffer> *this)

{
  dying_buffer *in_RDI;
  dying_buffer *in_stack_fffffffffffffff0;
  
  dying_buffer::dying_buffer(in_stack_fffffffffffffff0);
  (in_RDI->super_test_buffer<int>).super_basic_buffer<int>._vptr_basic_buffer =
       (_func_int **)&PTR_grow_00265428;
  internal::ImplicitCast_<dying_buffer*>(in_RDI);
  Mock::FailUninterestingCalls((void *)0x12604b);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }